

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_dispatch.c
# Opt level: O1

void lj_dispatch_init(GG_State *GG)

{
  ushort uVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    uVar1 = *(ushort *)((long)lj_bc_ofs + lVar2);
    *(code **)((long)GG->dispatch + lVar2 * 4) = lj_BC_ISLT + uVar1;
    *(code **)((long)GG->dispatch + lVar2 * 4 + 0x4d0) = lj_BC_ISLT + uVar1;
    lVar2 = lVar2 + 2;
  } while (lVar2 != 0xb2);
  lVar2 = 0;
  do {
    GG->dispatch[lVar2 + 0x59] = lj_BC_ISLT + lj_bc_ofs[lVar2 + 0x59];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x41);
  GG->dispatch[0x4f] = GG->dispatch[0x50];
  GG->dispatch[0x52] = GG->dispatch[0x53];
  GG->dispatch[0x55] = GG->dispatch[0x56];
  GG->dispatch[0x59] = GG->dispatch[0x5a];
  GG->dispatch[0x5c] = GG->dispatch[0x5d];
  (GG->g).bc_cfunc_int = 0x145f;
  (GG->g).bc_cfunc_ext = 0x145f;
  lVar2 = 0;
  do {
    GG->bcff[lVar2] = (int)lVar2 + 0x61;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x39);
  return;
}

Assistant:

void lj_dispatch_init(GG_State *GG)
{
  uint32_t i;
  ASMFunction *disp = GG->dispatch;
  for (i = 0; i < GG_LEN_SDISP; i++)
    disp[GG_LEN_DDISP+i] = disp[i] = makeasmfunc(lj_bc_ofs[i]);
  for (i = GG_LEN_SDISP; i < GG_LEN_DDISP; i++)
    disp[i] = makeasmfunc(lj_bc_ofs[i]);
  /* The JIT engine is off by default. luaopen_jit() turns it on. */
  disp[BC_FORL] = disp[BC_IFORL];
  disp[BC_ITERL] = disp[BC_IITERL];
  disp[BC_LOOP] = disp[BC_ILOOP];
  disp[BC_FUNCF] = disp[BC_IFUNCF];
  disp[BC_FUNCV] = disp[BC_IFUNCV];
  GG->g.bc_cfunc_ext = GG->g.bc_cfunc_int = BCINS_AD(BC_FUNCC, LUA_MINSTACK, 0);
  for (i = 0; i < GG_NUM_ASMFF; i++)
    GG->bcff[i] = BCINS_AD(BC__MAX+i, 0, 0);
#if LJ_TARGET_MIPS
  memcpy(GG->got, dispatch_got, LJ_GOT__MAX*sizeof(ASMFunction *));
#endif
}